

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::Array<kj::StringPtr>::~Array(Array<kj::StringPtr> *this)

{
  char (*pacVar1) [7];
  size_t sVar2;
  
  pacVar1 = this->ptr;
  if (pacVar1 != (char (*) [7])0x0) {
    sVar2 = this->size_;
    this->ptr = (char (*) [7])0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,pacVar1,0x10,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }